

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::ValueTranslator::fillStructValue
          (ValueTranslator *this,Builder builder,Reader assignments)

{
  short sVar1;
  ErrorReporter *pEVar2;
  Builder builder_00;
  Reader src;
  Field field_00;
  Reader assignments_00;
  ListElementCount LVar3;
  undefined8 uVar4;
  SegmentReader *pSVar5;
  CapTableReader *pCVar6;
  void *pvVar7;
  WirePointer *pWVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  char (*params) [20];
  char *pcVar11;
  char (*in_R8) [3];
  StringPtr SVar12;
  Type type;
  StringPtr message;
  StringPtr message_00;
  IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
  local_230;
  NullableValue<capnp::Orphan<capnp::DynamicValue>_> compiledValue;
  undefined8 uStack_1e0;
  Reader value;
  NullableValue<capnp::StructSchema::Field> field;
  ArrayPtr<const_char> local_130;
  Reader local_f0;
  BuilderFor<DynamicStruct> local_c0;
  Reader fieldName;
  Reader assignment;
  
  LVar3 = assignments.reader.elementCount;
  local_230.container = &assignments;
  local_230.index = 0;
  while( true ) {
    if (local_230.index == LVar3) break;
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
    ::operator*(&assignment,&local_230);
    if ((assignment._reader.dataSize < 0x10) || (*assignment._reader.data != 1)) {
      pEVar2 = this->errorReporter;
      Expression::Param::Reader::getValue((Reader *)&field,&assignment);
      kj::str<char_const(&)[20]>((String *)&compiledValue,(kj *)"Missing field name.",params);
      pcVar11 = "";
      if (compiledValue.field_1._0_8_ != 0) {
        pcVar11 = (char *)CONCAT71(compiledValue._1_7_,compiledValue.isSet);
      }
      SVar12.content.size_ = compiledValue.field_1._0_8_ + (ulong)(compiledValue.field_1._0_8_ == 0)
      ;
      SVar12.content.ptr = pcVar11;
      ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader>(pEVar2,(Reader *)&field,SVar12)
      ;
      kj::Array<char>::~Array((Array<char> *)&compiledValue);
    }
    else {
      Expression::Param::Reader::getNamed(&fieldName,&assignment);
      local_130.ptr = (char *)builder.schema.super_Schema.raw;
      SVar12.content = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&fieldName);
      StructSchema::findFieldByName
                ((Maybe<capnp::StructSchema::Field> *)&compiledValue,(StructSchema *)&local_130,
                 SVar12);
      uVar4 = compiledValue.field_1.value.builder.segment;
      field.isSet = compiledValue.isSet;
      if (compiledValue.isSet == true) {
        field.field_1._48_8_ = compiledValue.field_1.value.builder.location;
        uVar9 = field.field_1._48_8_;
        field.field_1._56_8_ = uStack_1e0;
        field.field_1.value.proto._reader.data = compiledValue.field_1.value.builder.segment;
        field.field_1.value.proto._reader.pointers =
             (WirePointer *)compiledValue.field_1.value.builder.capTable;
        field.field_1.value.proto._reader.segment = (SegmentReader *)compiledValue.field_1._16_8_;
        field.field_1.value.proto._reader.capTable =
             (CapTableReader *)compiledValue.field_1.value.builder.tag.content;
        field.field_1.value.parent.super_Schema.raw =
             (StructSchema)(StructSchema)compiledValue.field_1._0_8_;
        field.field_1._8_8_ = compiledValue.field_1._8_8_;
        field.field_1.value.proto._reader.dataSize =
             (StructDataBitCount)compiledValue.field_1.value.builder.location;
        uVar10 = field.field_1.value.proto._reader.dataSize;
        field.field_1._48_8_ = uVar9;
        Expression::Param::Reader::getValue(&value,&assignment);
        uVar9 = value._reader._40_8_;
        pWVar8 = value._reader.pointers;
        pvVar7 = value._reader.data;
        pCVar6 = value._reader.capTable;
        pSVar5 = value._reader.segment;
        if (((uint)uVar10 < 0x50) ||
           (sVar1 = (short)(((SegmentBuilder *)uVar4)->super_SegmentReader).id.value, sVar1 == 0)) {
          src._reader.pointerCount = value._reader.pointerCount;
          src._reader._38_2_ = value._reader._38_2_;
          src._reader.dataSize = value._reader.dataSize;
          type = StructSchema::Field::getType(&field.field_1.value);
          uVar4 = value._reader._40_8_;
          src._reader.capTable = pCVar6;
          src._reader.segment = pSVar5;
          src._reader.data = pvVar7;
          src._reader.pointers = pWVar8;
          value._reader.nestingLimit = (int)uVar9;
          value._reader._44_4_ = SUB84(uVar9,4);
          src._reader.nestingLimit = value._reader.nestingLimit;
          src._reader._44_4_ = value._reader._44_4_;
          value._reader._40_8_ = uVar4;
          compileValue((Maybe<capnp::Orphan<capnp::DynamicValue>_> *)&local_130,this,src,type);
          kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::NullableValue
                    (&compiledValue,(NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)&local_130
                    );
          kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue
                    ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)&local_130);
          if (compiledValue.isSet == true) {
            field_00._8_8_ = field.field_1._8_8_;
            field_00.parent.super_Schema.raw =
                 (Schema)(Schema)field.field_1.value.parent.super_Schema.raw;
            field_00.proto._reader.segment = field.field_1.value.proto._reader.segment;
            field_00.proto._reader.capTable = field.field_1.value.proto._reader.capTable;
            field_00.proto._reader.data = field.field_1.value.proto._reader.data;
            field_00.proto._reader.pointers = field.field_1.value.proto._reader.pointers;
            field_00.proto._reader.dataSize = field.field_1._48_4_;
            field_00.proto._reader.pointerCount = field.field_1._52_2_;
            field_00.proto._reader._38_2_ = field.field_1._54_2_;
            field_00.proto._reader._40_8_ = field.field_1._56_8_;
            DynamicStruct::Builder::adopt(&builder,field_00,&compiledValue.field_1.value);
          }
          kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue(&compiledValue);
        }
        else if (sVar1 == 1) {
          if ((value._reader.dataSize < 0x10) || (*value._reader.data != 7)) {
            message_00.content.size_ = 0x1f;
            message_00.content.ptr = "Type mismatch; expected group.";
            ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                      (this->errorReporter,&value,message_00);
          }
          else {
            DynamicStruct::Builder::init((Builder *)&compiledValue,(EVP_PKEY_CTX *)&builder);
            DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                      (&local_c0,(Builder *)&compiledValue);
            Expression::Reader::getTuple(&local_f0,&value);
            builder_00.builder.segment = local_c0.builder.segment;
            builder_00.schema.super_Schema.raw = local_c0.schema.super_Schema.raw;
            builder_00.builder.capTable = local_c0.builder.capTable;
            builder_00.builder.data = local_c0.builder.data;
            builder_00.builder.pointers = local_c0.builder.pointers;
            builder_00.builder.dataSize = local_c0.builder.dataSize;
            builder_00.builder.pointerCount = local_c0.builder.pointerCount;
            builder_00.builder._38_2_ = local_c0.builder._38_2_;
            assignments_00.reader.capTable = local_f0.reader.capTable;
            assignments_00.reader.segment = local_f0.reader.segment;
            assignments_00.reader.ptr = local_f0.reader.ptr;
            assignments_00.reader.elementCount = local_f0.reader.elementCount;
            assignments_00.reader.step = local_f0.reader.step;
            assignments_00.reader.structDataSize = local_f0.reader.structDataSize;
            assignments_00.reader.structPointerCount = local_f0.reader.structPointerCount;
            assignments_00.reader.elementSize = local_f0.reader.elementSize;
            assignments_00.reader._39_1_ = local_f0.reader._39_1_;
            assignments_00.reader.nestingLimit = local_f0.reader.nestingLimit;
            assignments_00.reader._44_4_ = local_f0.reader._44_4_;
            fillStructValue(this,builder_00,assignments_00);
            DynamicValue::Builder::~Builder((Builder *)&compiledValue);
          }
        }
      }
      else {
        pEVar2 = this->errorReporter;
        local_130 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&fieldName);
        kj::str<char_const(&)[28],capnp::Text::Reader,char_const(&)[3]>
                  ((String *)&compiledValue,(kj *)"Struct has no field named \'",
                   (char (*) [28])&local_130,(Reader *)0x57781c,in_R8);
        pcVar11 = "";
        if (compiledValue.field_1._0_8_ != 0) {
          pcVar11 = (char *)CONCAT71(compiledValue._1_7_,compiledValue.isSet);
        }
        message.content.size_ =
             compiledValue.field_1._0_8_ + (ulong)(compiledValue.field_1._0_8_ == 0);
        message.content.ptr = pcVar11;
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>(pEVar2,&fieldName,message);
        kj::Array<char>::~Array((Array<char> *)&compiledValue);
      }
    }
    local_230.index = local_230.index + 1;
  }
  return;
}

Assistant:

void ValueTranslator::fillStructValue(DynamicStruct::Builder builder,
                                      List<Expression::Param>::Reader assignments) {
  for (auto assignment: assignments) {
    if (assignment.isNamed()) {
      auto fieldName = assignment.getNamed();
      KJ_IF_MAYBE(field, builder.getSchema().findFieldByName(fieldName.getValue())) {
        auto fieldProto = field->getProto();
        auto value = assignment.getValue();

        switch (fieldProto.which()) {
          case schema::Field::SLOT:
            KJ_IF_MAYBE(compiledValue, compileValue(value, field->getType())) {
              builder.adopt(*field, kj::mv(*compiledValue));
            }
            break;

          case schema::Field::GROUP:
            if (value.isTuple()) {
              fillStructValue(builder.init(*field).as<DynamicStruct>(), value.getTuple());
            } else {
              errorReporter.addErrorOn(value, "Type mismatch; expected group.");
            }
            break;
        }
      } else {
        errorReporter.addErrorOn(fieldName, kj::str(
            "Struct has no field named '", fieldName.getValue(), "'."));
      }
    } else {
      errorReporter.addErrorOn(assignment.getValue(), kj::str("Missing field name."));
    }
  }
}